

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::num_writer>
             *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> it_00;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> __first;
  size_t sVar1;
  size_t *in_RSI;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *in_RDI;
  num_writer *unaff_retaddr;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  size_t local_20;
  undefined1 local_18;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it_01;
  
  it_01 = in_RDI;
  sVar1 = basic_string_view<char>::size
                    ((basic_string_view<char> *)
                     &(in_RDI->super_truncating_iterator_base<char_*>).limit_);
  if (sVar1 != 0) {
    basic_string_view<char>::begin
              ((basic_string_view<char> *)&(in_RDI->super_truncating_iterator_base<char_*>).limit_);
    basic_string_view<char>::end
              ((basic_string_view<char> *)&(in_RDI->super_truncating_iterator_base<char_*>).limit_);
    in_stack_ffffffffffffffb0 = *in_RSI;
    in_stack_ffffffffffffffc0 = in_RSI[2];
    in_stack_ffffffffffffffc8 = in_RSI[3];
    it_00.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffff98;
    it_00.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffff90;
    it_00.super_truncating_iterator_base<char_*>.count_ = in_stack_ffffffffffffffa0;
    it_00.blackhole_ = in_stack_ffffffffffffffa8;
    it_00._25_7_ = in_stack_ffffffffffffffa9;
    internal::
    copy_str<char,char_const*,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,it_00);
    *in_RSI = in_stack_ffffffffffffffd0;
    in_RSI[1] = in_stack_ffffffffffffffd8;
    in_RSI[2] = local_20;
    *(undefined1 *)(in_RSI + 3) = local_18;
  }
  __first.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffffc8;
  __first.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffffc0;
  __first.super_truncating_iterator_base<char_*>.count_ = in_stack_ffffffffffffffd0;
  __first._24_8_ = in_stack_ffffffffffffffd8;
  std::
  fill_n<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
            (__first,in_stack_ffffffffffffffb0,
             (char *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8));
  *in_RSI = in_stack_ffffffffffffff90;
  in_RSI[1] = in_stack_ffffffffffffff98;
  in_RSI[2] = in_stack_ffffffffffffffa0;
  *(undefined1 *)(in_RSI + 3) = in_stack_ffffffffffffffa8;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
            (unaff_retaddr,it_01);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }